

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

size_t MuxImageDiskSize(WebPMuxImage *wpi)

{
  size_t sVar1;
  size_t sVar2;
  
  if (wpi->header == (WebPChunk *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (ulong)((int)(wpi->header->data).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->alpha != (WebPChunk *)0x0) {
    sVar2 = sVar2 + ((int)(wpi->alpha->data).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->img != (WebPChunk *)0x0) {
    sVar2 = sVar2 + ((int)(wpi->img->data).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->unknown != (WebPChunk *)0x0) {
    sVar1 = ChunkListDiskSize(wpi->unknown);
    sVar2 = sVar2 + sVar1;
  }
  return sVar2;
}

Assistant:

size_t MuxImageDiskSize(const WebPMuxImage* const wpi) {
  size_t size = 0;
  if (wpi->header != NULL) size += ChunkDiskSize(wpi->header);
  if (wpi->alpha != NULL) size += ChunkDiskSize(wpi->alpha);
  if (wpi->img != NULL) size += ChunkDiskSize(wpi->img);
  if (wpi->unknown != NULL) size += ChunkListDiskSize(wpi->unknown);
  return size;
}